

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_error.cpp
# Opt level: O0

unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> __thiscall
pfederc::Parser::generateError
          (Parser *this,
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          *syntaxError)

{
  pointer this_00;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  *in_RDX;
  Position *pos;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  *syntaxError_local;
  Parser *this_local;
  
  this_00 = std::
            unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
            ::operator->(in_RDX);
  Error<pfederc::SyntaxErrorCode>::getPosition(this_00);
  std::
  vector<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
  ::push_back((vector<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
               *)(syntaxError + 1),in_RDX);
  std::make_unique<pfederc::ErrorExpr,pfederc::Lexer&,pfederc::Position_const&>
            ((Lexer *)this,
             (Position *)
             (syntaxError->_M_t).
             super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
             .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>._M_head_impl)
  ;
  return (__uniq_ptr_data<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>,_true,_true>)
         (__uniq_ptr_data<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ErrorExpr> Parser::generateError(
    std::unique_ptr<SyntaxError> &&syntaxError) noexcept {
  
  const Position &pos = syntaxError->getPosition();
  errors.push_back(std::move(syntaxError));

  return std::make_unique<ErrorExpr>(lexer, pos);
}